

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O0

bool slang::ast::Lookup::withinClassRandomize
               (ASTContext *context,NameSyntax *syntax,bitmask<slang::ast::LookupFlags> flags,
               LookupResult *result)

{
  LookupLocation lookupLocation;
  SourceRange range;
  string_view name_00;
  SourceRange range_00;
  SourceRange range_01;
  optional<slang::SourceRange> range_02;
  bool bVar1;
  Symbol *pSVar2;
  reference pNVar3;
  bool *pbVar4;
  long *in_RCX;
  undefined4 in_EDX;
  SyntaxNode *in_RSI;
  long in_RDI;
  LookupResult *in_stack_00000018;
  ASTContext *in_stack_00000020;
  bitmask<slang::ast::LookupFlags> in_stack_0000002c;
  undefined1 in_stack_00000030 [16];
  optional<bool> isClass;
  NameComponents in_stack_00000150;
  ASTContext classContext;
  NameComponents name;
  anon_class_16_2_84665f96 findSuperScope;
  Scope *classScope;
  RandomizeDetails *details;
  NameSyntax *first;
  SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL> nameParts;
  int colonParts;
  SourceRange *in_stack_fffffffffffffbd8;
  SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc> *in_stack_fffffffffffffbe0;
  SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL> *in_stack_fffffffffffffbe8;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffbf0;
  Scope *in_stack_fffffffffffffbf8;
  undefined8 in_stack_fffffffffffffc00;
  LookupResult *in_stack_fffffffffffffc28;
  undefined6 in_stack_fffffffffffffc30;
  undefined1 in_stack_fffffffffffffc36;
  undefined1 in_stack_fffffffffffffc37;
  SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc> *in_stack_fffffffffffffc38;
  undefined6 in_stack_fffffffffffffc40;
  undefined2 in_stack_fffffffffffffc46;
  undefined4 in_stack_fffffffffffffc48;
  bitmask<slang::ast::LookupFlags> in_stack_fffffffffffffc4c;
  NameSyntax *in_stack_fffffffffffffc58;
  NameComponents *in_stack_fffffffffffffc60;
  LookupResult *in_stack_fffffffffffffc88;
  Scope *in_stack_fffffffffffffc90;
  undefined8 in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffca0;
  SyntaxKind SVar5;
  SyntaxNode *in_stack_fffffffffffffca8;
  bitmask<slang::ast::LookupFlags> flags_00;
  bitmask<slang::ast::ASTFlags> local_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  SourceLocation local_268;
  undefined8 in_stack_fffffffffffffda0;
  SourceLocation SVar6;
  undefined1 unwrapGenericClasses;
  LookupResult *in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  SourceLocation in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc8 [12];
  undefined4 in_stack_fffffffffffffdd4;
  basic_string_view<char,_std::char_traits<char>_> local_1d8;
  SourceLocation local_1c8;
  SourceLocation SStack_1c0;
  pointer local_1b8;
  size_t sStack_1b0;
  ParameterValueAssignmentSyntax *in_stack_fffffffffffffe58;
  LookupResult *in_stack_fffffffffffffe60;
  NameComponents *name_01;
  int colonParts_00;
  SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc> *nameParts_00;
  bitmask<slang::ast::LookupFlags> flags_01;
  NameComponents *pNVar7;
  SyntaxNode *local_168;
  SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc> local_160 [3];
  int local_24;
  long *local_20;
  SyntaxNode *local_18;
  long local_10;
  undefined4 local_8;
  byte local_1;
  
  unwrapGenericClasses = (undefined1)((ulong)in_stack_fffffffffffffda0 >> 0x38);
  local_24 = 0;
  local_20 = in_RCX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_8 = in_EDX;
  SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL>::SmallVector
            ((SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL> *)0x129b10e);
  local_168 = local_18;
  if (local_18->kind == ScopedName) {
    slang::syntax::SyntaxNode::as<slang::syntax::ScopedNameSyntax>(local_18);
    in_stack_fffffffffffffca8 =
         (SyntaxNode *)
         anon_unknown_39::splitScopedName
                   ((ScopedNameSyntax *)
                    CONCAT26(in_stack_fffffffffffffc46,in_stack_fffffffffffffc40),
                    in_stack_fffffffffffffc38,
                    (int *)CONCAT17(in_stack_fffffffffffffc37,
                                    CONCAT16(in_stack_fffffffffffffc36,in_stack_fffffffffffffc30)));
    local_168 = in_stack_fffffffffffffca8;
  }
  flags_00.m_bits = (underlying_type)((ulong)in_stack_fffffffffffffca8 >> 0x20);
  name_01 = *(NameComponents **)(local_10 + 0x28);
  nameParts_00 = (SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc> *)
                 (name_01->text)._M_len;
  pNVar7 = name_01;
  anon_unknown_39::NameComponents::NameComponents
            (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  colonParts_00 = (int)((ulong)local_10 >> 0x20);
  SVar5 = (((ExpressionSyntax *)&local_168->kind)->super_SyntaxNode).kind;
  if ((SVar5 == ClassName) || (SVar5 - IdentifierName < 2)) {
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_1d8);
    if (bVar1) {
      local_1 = 0;
      goto LAB_0129b8d6;
    }
    bVar1 = std::
            span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
            ::empty((span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
                     *)0x129b29a);
    if (!bVar1) {
      std::ranges::__find_fn::
      operator()<const_std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>_&,_std::basic_string_view<char,_std::char_traits<char>_>,_std::identity>
                ((__find_fn *)&std::ranges::find,&pNVar7->range,&local_1d8);
      std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
      ::end((span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
             *)in_stack_fffffffffffffbe8);
      bVar1 = __gnu_cxx::
              operator==<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>_>
                        ((__normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>_>
                          *)in_stack_fffffffffffffbe0,
                         (__normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>_>
                          *)in_stack_fffffffffffffbd8);
      if (bVar1) {
        local_1 = 0;
        goto LAB_0129b8d6;
      }
    }
    flags_01.m_bits = (underlying_type)pNVar7;
    name_00._M_len._6_2_ = in_stack_fffffffffffffc46;
    name_00._M_len._0_6_ = in_stack_fffffffffffffc40;
    name_00._M_str._0_4_ = in_stack_fffffffffffffc48;
    name_00._M_str._4_4_ = in_stack_fffffffffffffc4c.m_bits;
    pSVar2 = Scope::find((Scope *)in_stack_fffffffffffffc38,name_00);
    *local_20 = (long)pSVar2;
  }
  else if (SVar5 == SuperHandle) {
    withinClassRandomize::anon_class_16_2_84665f96::operator()
              ((anon_class_16_2_84665f96 *)in_stack_fffffffffffffbe8);
    flags_01.m_bits = (underlying_type)pNVar7;
    local_268 = local_1c8;
    range_01.endLoc._0_4_ = in_stack_fffffffffffffca0;
    range_01.startLoc = (SourceLocation)in_stack_fffffffffffffc98;
    range_01.endLoc._4_4_ = SVar5;
    SVar6 = SStack_1c0;
    pSVar2 = anon_unknown_39::findSuperHandle
                       (in_stack_fffffffffffffc90,flags_00,range_01,in_stack_fffffffffffffc88);
    unwrapGenericClasses = SVar6._7_1_;
    *local_20 = (long)pSVar2;
    local_24 = 1;
    in_stack_fffffffffffffdb4 = local_8;
  }
  else {
    if (SVar5 != ThisHandle) {
      local_1 = 0;
      goto LAB_0129b8d6;
    }
    *local_20 = (long)(pNVar7->text)._M_str;
    if (*local_20 == 0) {
      in_stack_fffffffffffffc88 =
           (LookupResult *)
           not_null<const_slang::ast::Scope_*>::operator*
                     ((not_null<const_slang::ast::Scope_*> *)0x129b3ab);
      range.endLoc._0_6_ = in_stack_fffffffffffffc40;
      range.startLoc = (SourceLocation)in_stack_fffffffffffffc38;
      range.endLoc._6_2_ = in_stack_fffffffffffffc46;
      pSVar2 = anon_unknown_39::findThisHandle
                         ((Scope *)CONCAT17(in_stack_fffffffffffffc37,
                                            CONCAT16(in_stack_fffffffffffffc36,
                                                     in_stack_fffffffffffffc30)),
                          in_stack_fffffffffffffc4c,range,in_stack_fffffffffffffc28);
      *local_20 = (long)pSVar2;
    }
    flags_01.m_bits = (underlying_type)pNVar7;
    if ((*local_20 != 0) &&
       (pNVar3 = SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>::back(local_160),
       pNVar3->kind == SuperHandle)) {
      pNVar3 = SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>::back(local_160);
      in_stack_fffffffffffffe58 = (pNVar3->name).paramAssignments;
      local_1d8._M_len = (pNVar3->name).text._M_len;
      local_1d8._M_str = (pNVar3->name).text._M_str;
      local_1c8 = (pNVar3->name).range.startLoc;
      SStack_1c0 = (pNVar3->name).range.endLoc;
      local_1b8 = (pNVar3->name).selectors._M_ptr;
      sStack_1b0 = (pNVar3->name).selectors._M_extent._M_extent_value;
      SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>::pop_back
                (in_stack_fffffffffffffbe0);
      withinClassRandomize::anon_class_16_2_84665f96::operator()
                ((anon_class_16_2_84665f96 *)in_stack_fffffffffffffbe8);
      range_00.endLoc._0_4_ = in_stack_fffffffffffffca0;
      range_00.startLoc = (SourceLocation)in_stack_fffffffffffffc98;
      range_00.endLoc._4_4_ = SVar5;
      in_stack_fffffffffffffdc0 = SStack_1c0;
      pSVar2 = anon_unknown_39::findSuperHandle
                         (in_stack_fffffffffffffc90,flags_00,range_00,in_stack_fffffffffffffc88);
      *local_20 = (long)pSVar2;
      local_24 = 1;
      in_stack_fffffffffffffdd4 = local_8;
    }
  }
  if (*local_20 == 0) {
    local_1 = 0;
    goto LAB_0129b8d6;
  }
  local_2b8 = LookupLocation::max;
  uStack_2b0 = DAT_01a3c808;
  bitmask<slang::ast::ASTFlags>::bitmask(&local_2c0,None);
  lookupLocation._8_8_ = in_stack_fffffffffffffc00;
  lookupLocation.scope = in_stack_fffffffffffffbf8;
  ASTContext::ASTContext
            ((ASTContext *)in_stack_fffffffffffffbe8,(Scope *)in_stack_fffffffffffffbe0,
             lookupLocation,in_stack_fffffffffffffbf0);
  if (local_24 == 0) {
    std::span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>::
    span<slang::SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL>_&>
              ((span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL> *
               )in_stack_fffffffffffffbf0.m_bits,in_stack_fffffffffffffbe8);
    in_stack_fffffffffffffbd8 = (SourceRange *)local_1d8._M_len;
    in_stack_fffffffffffffbe0 =
         (SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc> *)local_1d8._M_str;
    in_stack_fffffffffffffc36 =
         anon_unknown_39::lookupDownward
                   ((span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>
                     )in_stack_00000030,in_stack_00000150,in_stack_00000020,in_stack_0000002c,
                    in_stack_00000018);
    if (!(bool)in_stack_fffffffffffffc36) {
      local_1 = 0;
      goto LAB_0129b8d6;
    }
  }
  else {
    anon_unknown_39::isClassType((Symbol *)in_stack_fffffffffffffbe8);
    bVar1 = std::optional<bool>::has_value((optional<bool> *)0x129b69f);
    if ((!bVar1) ||
       (pbVar4 = std::optional<bool>::value((optional<bool> *)in_stack_fffffffffffffbe0),
       (*pbVar4 & 1U) == 0)) {
      local_1 = 0;
      goto LAB_0129b8d6;
    }
    in_stack_fffffffffffffc37 =
         anon_unknown_39::resolveColonNames
                   (nameParts_00,colonParts_00,name_01,flags_01,in_stack_fffffffffffffe60,
                    (ASTContext *)in_stack_fffffffffffffe58);
    if (!(bool)in_stack_fffffffffffffc37) {
      local_1 = 0;
      goto LAB_0129b8d6;
    }
  }
  not_null<const_slang::ast::Scope_*>::operator*((not_null<const_slang::ast::Scope_*> *)0x129b841);
  slang::syntax::SyntaxNode::sourceRange
            ((SyntaxNode *)
             CONCAT17(in_stack_fffffffffffffc37,
                      CONCAT16(in_stack_fffffffffffffc36,in_stack_fffffffffffffc30)));
  std::optional<slang::SourceRange>::optional<slang::SourceRange,_true>
            ((optional<slang::SourceRange> *)in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  range_02.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._8_12_ = in_stack_fffffffffffffdc8;
  range_02.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc =
       in_stack_fffffffffffffdc0;
  range_02.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._20_4_ = in_stack_fffffffffffffdd4;
  anon_unknown_39::unwrapResult
            ((Scope *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),range_02,
             in_stack_fffffffffffffda8,(bool)unwrapGenericClasses);
  local_1 = 1;
LAB_0129b8d6:
  SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL>::~SmallVector
            ((SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL> *)0x129b8e3);
  return (bool)(local_1 & 1);
}

Assistant:

bool Lookup::withinClassRandomize(const ASTContext& context, const NameSyntax& syntax,
                                  bitmask<LookupFlags> flags, LookupResult& result) {
    int colonParts = 0;
    SmallVector<NamePlusLoc, 4> nameParts;
    const NameSyntax* first = &syntax;
    if (syntax.kind == SyntaxKind::ScopedName)
        first = splitScopedName(syntax.as<ScopedNameSyntax>(), nameParts, colonParts);

    SLANG_ASSERT(context.randomizeDetails);
    auto& details = *context.randomizeDetails;
    auto& classScope = *details.classType;

    auto findSuperScope = [&]() -> const Scope& {
        if (details.thisVar) {
            auto dt = details.thisVar->getDeclaredType();
            SLANG_ASSERT(dt);
            return dt->getType().getCanonicalType().as<ClassType>();
        }

        return *context.scope;
    };

    NameComponents name = *first;
    switch (first->kind) {
        case SyntaxKind::IdentifierName:
        case SyntaxKind::IdentifierSelectName:
        case SyntaxKind::ClassName:
            if (name.text.empty())
                return false;

            // If the nameRestrictions list is not empty, we have to verify that the
            // first element is in the list. Otherwise, an empty list indicates that
            // the lookup is unrestricted.
            if (!details.nameRestrictions.empty()) {
                if (std::ranges::find(details.nameRestrictions, name.text) ==
                    details.nameRestrictions.end()) {
                    return false;
                }
            }

            result.found = classScope.find(name.text);
            break;
        case SyntaxKind::ThisHandle:
            result.found = details.thisVar;
            if (!result.found)
                result.found = findThisHandle(*context.scope, flags, name.range, result);

            if (result.found && nameParts.back().kind == SyntaxKind::SuperHandle) {
                // Handle "this.super.whatever" the same as if the user had just
                // written "super.whatever".
                name = nameParts.back().name;
                nameParts.pop_back();
                result.found = findSuperHandle(findSuperScope(), flags, name.range, result);
                colonParts = 1;
            }
            break;
        case SyntaxKind::SuperHandle:
            result.found = findSuperHandle(findSuperScope(), flags, name.range, result);
            colonParts = 1; // pretend we used colon access to resolve class scoped name
            break;
        default:
            // Return not found; the caller should do a normal lookup
            // to handle any of these other cases.
            return false;
    }

    if (!result.found)
        return false;

    ASTContext classContext(classScope, LookupLocation::max);
    if (colonParts) {
        // Disallow package lookups in this function.
        auto isClass = isClassType(*result.found);
        if (!isClass.has_value() || !isClass.value())
            return false;

        if (!resolveColonNames(nameParts, colonParts, name, flags, result, classContext))
            return false;
    }
    else {
        if (!lookupDownward(nameParts, name, classContext, flags, result))
            return false;
    }

    unwrapResult(*context.scope, syntax.sourceRange(), result);
    return true;
}